

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Own<kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AdapterPromiseNode<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter>,kj::_::PromiseDisposer,kj::UnixEventPort&,int&>
          (PromiseDisposer *this,UnixEventPort *params,int *params_1)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x400);
  AdapterPromiseNode<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter>::
  AdapterPromiseNode<kj::UnixEventPort&,int&>
            ((AdapterPromiseNode<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter> *)
             ((long)pvVar1 + 400),params,params_1);
  *(void **)((long)pvVar1 + 0x198) = pvVar1;
  *(AdapterPromiseNode<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter> **)this =
       (AdapterPromiseNode<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter> *)((long)pvVar1 + 400)
  ;
  return (Own<kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>,_kj::_::PromiseDisposer>
          )(AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }